

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapSort.c
# Opt level: O0

void HeapSort(int *sort,int length)

{
  int iVar1;
  int local_1c;
  int temp;
  int i_1;
  int i;
  int length_local;
  int *sort_local;
  
  temp = length / 2;
  while (temp = temp + -1, -1 < temp) {
    HeapAdjust(sort,temp,length);
  }
  for (local_1c = length + -1; -1 < local_1c; local_1c = local_1c + -1) {
    iVar1 = sort[local_1c];
    sort[local_1c] = *sort;
    *sort = iVar1;
    HeapAdjust(sort,0,local_1c);
  }
  return;
}

Assistant:

void HeapSort(int sort[], int length)
{
    // 初始化堆
    // length / 2 - 1是二叉树中最后一个非叶子结点的序号
    for (int i = length / 2 - 1; i >= 0; i--)
    {
        HeapAdjust(sort, i, length);
    }
    // 交换堆顶元素和最后一个元素
    for (int i = length - 1; i >= 0; i--)
    {
        int temp;
        temp = sort[i];
        sort[i] = sort[0];
        sort[0] = temp;
        HeapAdjust(sort, 0, i);
    }
}